

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Particle.h
# Opt level: O0

void __thiscall
pica::Particle<(pica::Dimension)1>::setVelocity
          (Particle<(pica::Dimension)1> *this,MomentumType *newVelocity)

{
  Vector3<double> *in_RSI;
  Vector3<double> *in_RDI;
  double dVar1;
  double local_28;
  double local_20;
  double local_18;
  
  dVar1 = Vector3<double>::norm2(in_RSI);
  sqrt(8.987551787368177e+20 - dVar1);
  operator/(in_RDI,(double)in_RSI);
  in_RDI->y = local_28;
  in_RDI->z = local_20;
  in_RDI[1].x = local_18;
  dVar1 = Vector3<double>::norm2((Vector3<double> *)&in_RDI->y);
  dVar1 = sqrt(dVar1 + 1.0);
  in_RDI[1].z = 1.0 / dVar1;
  return;
}

Assistant:

void setVelocity(const MomentumType& newVelocity)
    {
        p = newVelocity / sqrt(constants::c * constants::c - newVelocity.norm2());
        invGamma = (FP)1 / sqrt((FP)1 + p.norm2());
    }